

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void u_on_sstairs(void)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  int local_c;
  xchar y;
  xchar x;
  int trycnt;
  
  if ((level->sstairs).sx == '\0') {
    local_c = 0;
    while( true ) {
      iVar2 = rnd(0x4f);
      iVar3 = rn2(0x15);
      bVar1 = badspot((xchar)iVar2,(char)iVar3);
      if (bVar1 == '\0') break;
      local_c = local_c + 1;
      if (500 < local_c) {
        panic("u_on_sstairs: could not relocate player!");
      }
    }
    u_on_newpos((int)(xchar)iVar2,(int)(char)iVar3);
  }
  else {
    u_on_newpos((int)(level->sstairs).sx,(int)(level->sstairs).sy);
  }
  return;
}

Assistant:

void u_on_sstairs(void)
{

	if (level->sstairs.sx) {
	    u_on_newpos(level->sstairs.sx, level->sstairs.sy);
	} else {
	    /* code stolen from goto_level */
	    int trycnt = 0;
	    xchar x, y;

	    do {
		x = rnd(COLNO-1);
		y = rn2(ROWNO);
		if (!badspot(x, y)) {
		    u_on_newpos(x, y);
		    return;
		}
	    } while (++trycnt <= 500);
	    panic("u_on_sstairs: could not relocate player!");
	}
}